

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

shared_ptr<aeron::Counter> __thiscall
aeron::ClientConductor::findCounter(ClientConductor *this,int64_t registrationId)

{
  int32_t errorCode;
  long *plVar1;
  long lVar2;
  longlong lVar3;
  DriverTimeoutException *this_00;
  char *pcVar4;
  RegistrationException *this_01;
  long lVar5;
  long in_RDX;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar7;
  shared_ptr<aeron::Counter> sVar8;
  allocator local_d2;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(registrationId + 8))->__data);
  plVar7 = *(long **)(registrationId + 0x78);
  plVar1 = *(long **)(registrationId + 0x80);
  lVar5 = (long)plVar1 - (long)plVar7;
  lVar6 = lVar5 % 0x60;
  for (lVar2 = lVar5 / 0x60 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (*plVar7 == in_RDX) goto LAB_0014af34;
    if (plVar7[0xc] == in_RDX) {
      plVar7 = plVar7 + 0xc;
      goto LAB_0014af34;
    }
    if (plVar7[0x18] == in_RDX) {
      plVar7 = plVar7 + 0x18;
      goto LAB_0014af34;
    }
    if (plVar7[0x24] == in_RDX) {
      plVar7 = plVar7 + 0x24;
      goto LAB_0014af34;
    }
    plVar7 = plVar7 + 0x30;
    lVar5 = lVar5 + -0x180;
  }
  lVar2 = lVar5 / 0x60;
  lVar6 = lVar5 % 0x60;
  if (lVar2 == 1) {
LAB_0014af15:
    if (*plVar7 != in_RDX) {
      plVar7 = plVar1;
    }
LAB_0014af34:
    if (plVar7 != plVar1) {
      std::__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> *)this,plVar7 + 10,lVar6)
      ;
      if (plVar7[8] != 0) {
        std::__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> *)(plVar7 + 8));
      }
      if ((this->_vptr_ClientConductor == (_func_int **)0x0) && ((int)plVar7[3] == 0)) {
        lVar3 = std::function<long_long_()>::operator()
                          ((function<long_long_()> *)(registrationId + 0x1d8));
        if (*(long *)(registrationId + 0x210) + plVar7[2] < lVar3) {
          this_00 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
          std::operator+(&local_d0,"no response from driver in ",&local_70);
          std::operator+(&local_b0,&local_d0," ms");
          std::__cxx11::string::string
                    ((string *)&local_90,
                     "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)",
                     &local_d1);
          pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                     ,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                    );
          std::__cxx11::string::string((string *)&local_50,pcVar4,&local_d2);
          util::DriverTimeoutException::DriverTimeoutException
                    (this_00,&local_b0,&local_90,&local_50,0x171);
          __cxa_throw(this_00,&util::DriverTimeoutException::typeinfo,
                      util::SourcedException::~SourcedException);
        }
      }
      else if ((this->_vptr_ClientConductor == (_func_int **)0x0) && ((int)plVar7[3] == 2)) {
        this_01 = (RegistrationException *)__cxa_allocate_exception(0x50);
        errorCode = *(int32_t *)((long)plVar7 + 0x1c);
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)",
                   (allocator *)&local_70);
        pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_d0,pcVar4,(allocator *)&local_90);
        util::RegistrationException::RegistrationException
                  (this_01,errorCode,(string *)(plVar7 + 4),&local_b0,&local_d0,0x176);
        __cxa_throw(this_01,&util::RegistrationException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      goto LAB_0014b06c;
    }
  }
  else {
    if (lVar2 == 2) {
LAB_0014af0c:
      if (*plVar7 != in_RDX) {
        plVar7 = plVar7 + 0xc;
        goto LAB_0014af15;
      }
      goto LAB_0014af34;
    }
    if (lVar2 == 3) {
      if (*plVar7 != in_RDX) {
        plVar7 = plVar7 + 0xc;
        goto LAB_0014af0c;
      }
      goto LAB_0014af34;
    }
  }
  this->_vptr_ClientConductor = (_func_int **)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
LAB_0014b06c:
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar8.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<aeron::Counter>)
         sVar8.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Counter> ClientConductor::findCounter(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it == m_counters.end())
    {
        return std::shared_ptr<Counter>();
    }

    CounterStateDefn& state = *it;
    std::shared_ptr<Counter> counter = state.m_counter.lock();

    if (state.m_counterCache)
    {
        state.m_counterCache.reset();
    }

    if (!counter && RegistrationStatus::AWAITING_MEDIA_DRIVER == state.m_status)
    {
        if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
        {
            throw DriverTimeoutException(
                "no response from driver in " + std::to_string(m_driverTimeoutMs) + " ms", SOURCEINFO);
        }
    }
    else if (!counter && RegistrationStatus::ERRORED_MEDIA_DRIVER == state.m_status)
    {
        throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
    }

    return counter;
}